

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

void __thiscall t_st_generator::generate_force_consts(t_st_generator *this)

{
  ostream *poVar1;
  string sStack_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  class_name_abi_cxx11_(&local_38,this);
  prefix(&local_b8,this,&local_38);
  poVar1 = std::operator<<((ostream *)&this->f_,(string *)&local_b8);
  poVar1 = std::operator<<(poVar1," enums keysAndValuesDo: [:k :v | ");
  class_name_abi_cxx11_(&local_78,this);
  prefix(&sStack_d8,this,&local_78);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_d8);
  poVar1 = std::operator<<(poVar1," enums at: k put: v value].!");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_d8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  class_name_abi_cxx11_(&local_58,this);
  prefix(&local_b8,this,&local_58);
  poVar1 = std::operator<<((ostream *)&this->f_,(string *)&local_b8);
  poVar1 = std::operator<<(poVar1," constants keysAndValuesDo: [:k :v | ");
  class_name_abi_cxx11_(&local_98,this);
  prefix(&sStack_d8,this,&local_98);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_d8);
  poVar1 = std::operator<<(poVar1," constants at: k put: v value].!");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void t_st_generator::generate_force_consts() {
  f_ << prefix(class_name()) << " enums keysAndValuesDo: [:k :v | " << prefix(class_name())
     << " enums at: k put: v value].!" << endl;

  f_ << prefix(class_name()) << " constants keysAndValuesDo: [:k :v | " << prefix(class_name())
     << " constants at: k put: v value].!" << endl;
}